

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O1

Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::get_partial_multiplicative_identity
          (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  Characteristic CVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = *productOfCharacteristics;
  if (uVar1 == 0) {
    uVar5 = (uint)(1 < productOfAllCharacteristics_);
  }
  else {
    this->element_ = 0;
    uVar5 = 0;
    if ((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar4 = 0;
      uVar5 = 0;
      do {
        if (uVar1 % primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4] == 0) {
          uVar3 = partials_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
          if (productOfAllCharacteristics_ <= uVar3) {
            uVar3 = uVar3 % productOfAllCharacteristics_;
          }
          if (CARRY4(uVar5,uVar3)) {
            uVar5 = (uVar5 - productOfAllCharacteristics_) + uVar3;
          }
          else {
            CVar2 = 0;
            if (productOfAllCharacteristics_ <= uVar5 + uVar3) {
              CVar2 = productOfAllCharacteristics_;
            }
            uVar5 = (uVar5 + uVar3) - CVar2;
          }
        }
        uVar4 = uVar4 + 1;
      } while ((uVar4 & 0xffffffff) <
               (ulong)((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  this->element_ = uVar5;
  return (Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>)
         (Element_conflict)this;
}

Assistant:

static Shared_multi_field_element_with_small_characteristics get_partial_multiplicative_identity(
      const Characteristic& productOfCharacteristics) {
    if (productOfCharacteristics == 0) {
      return Shared_multi_field_element_with_small_characteristics(multiplicativeID_);
    }
    Shared_multi_field_element_with_small_characteristics mult;
    for (Characteristic idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        mult += partials_[idx];
      }
    }
    return mult;
  }